

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall
QPDFJob::addOutlinesToJson
          (QPDFJob *this,
          vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *outlines,
          JSON *j,map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                  *page_numbers)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> local_2a8;
  JSON local_290;
  allocator<char> local_279;
  JSON local_278 [2];
  undefined1 local_258 [8];
  JSON j_kids;
  JSON local_240 [2];
  JSON local_220;
  JSON local_210;
  QPDFObjGen local_200;
  QPDFObjGen og;
  JSON j_destpage;
  QPDFObjectHandle page;
  allocator<char> local_1c1;
  JSON local_1c0 [2];
  JSON local_1a0;
  undefined1 local_190 [40];
  JSON local_168 [2];
  JSON local_148;
  string local_138;
  JSON local_118;
  allocator<char> local_101;
  JSON local_100 [2];
  JSON local_e0;
  undefined1 local_d0 [40];
  JSON local_a8 [2];
  JSON local_88 [2];
  JSON local_68;
  undefined1 local_58 [8];
  JSON jo;
  QPDFOutlineObjectHelper *ol;
  iterator __end1;
  iterator __begin1;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *__range1;
  map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
  *page_numbers_local;
  JSON *j_local;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *outlines_local;
  QPDFJob *this_local;
  
  __end1 = std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::begin
                     (outlines);
  ol = (QPDFOutlineObjectHelper *)
       std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::end(outlines)
  ;
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<QPDFOutlineObjectHelper_*,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>
                                     *)&ol), bVar1) {
    jo.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<QPDFOutlineObjectHelper_*,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>
         ::operator*(&__end1);
    JSON::makeDictionary();
    JSON::addArrayElement((JSON *)local_58,j);
    JSON::~JSON(&local_68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a8,"object",(allocator<char> *)(local_d0 + 0x27));
    QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)local_d0);
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    QPDFObjectHandle::getJSON
              ((QPDFObjectHandle *)(local_d0 + 0x10),(int)local_d0,SUB41(peVar3->json_version,0));
    JSON::addDictionaryMember(local_88,(string *)local_58,local_a8);
    JSON::~JSON(local_88);
    JSON::~JSON((JSON *)(local_d0 + 0x10));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_d0);
    std::__cxx11::string::~string((string *)local_a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_d0 + 0x27));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_100,"title",&local_101);
    QPDFOutlineObjectHelper::getTitle_abi_cxx11_
              (&local_138,
               (QPDFOutlineObjectHelper *)
               jo.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
    JSON::makeString(&local_118,&local_138);
    JSON::addDictionaryMember(&local_e0,(string *)local_58,local_100);
    JSON::~JSON(&local_e0);
    JSON::~JSON(&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)local_100);
    std::allocator<char>::~allocator(&local_101);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_168,"dest",(allocator<char> *)(local_190 + 0x27));
    QPDFOutlineObjectHelper::getDest((QPDFOutlineObjectHelper *)local_190);
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    QPDFObjectHandle::getJSON
              ((QPDFObjectHandle *)(local_190 + 0x10),(int)local_190,SUB41(peVar3->json_version,0));
    JSON::addDictionaryMember(&local_148,(string *)local_58,local_168);
    JSON::~JSON(&local_148);
    JSON::~JSON((JSON *)(local_190 + 0x10));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_190);
    std::__cxx11::string::~string((string *)local_168);
    std::allocator<char>::~allocator((allocator<char> *)(local_190 + 0x27));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_1c0,"open",&local_1c1);
    iVar2 = QPDFOutlineObjectHelper::getCount
                      ((QPDFOutlineObjectHelper *)
                       jo.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
    JSON::makeBool((JSON *)&page.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (bool)((byte)~(byte)((uint)iVar2 >> 0x18) >> 7));
    JSON::addDictionaryMember(&local_1a0,(string *)local_58,local_1c0);
    JSON::~JSON(&local_1a0);
    JSON::~JSON((JSON *)&page.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)local_1c0);
    std::allocator<char>::~allocator(&local_1c1);
    QPDFOutlineObjectHelper::getDestPage
              ((QPDFOutlineObjectHelper *)
               &j_destpage.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    JSON::makeNull();
    bVar1 = QPDFObjectHandle::isIndirect
                      ((QPDFObjectHandle *)
                       &j_destpage.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    if (bVar1) {
      local_200 = QPDFObjectHandle::getObjGen
                            ((QPDFObjectHandle *)
                             &j_destpage.m.
                              super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
      sVar4 = std::
              map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
              ::count(page_numbers,&local_200);
      if (sVar4 != 0) {
        pmVar5 = std::
                 map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                 ::operator[](page_numbers,&local_200);
        JSON::makeInt(&local_210,(long)*pmVar5);
        JSON::operator=((JSON *)&og,&local_210);
        JSON::~JSON(&local_210);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_240,"destpageposfrom1",
               (allocator<char> *)
               ((long)&j_kids.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    JSON::addDictionaryMember(&local_220,(string *)local_58,local_240);
    JSON::~JSON(&local_220);
    std::__cxx11::string::~string((string *)local_240);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&j_kids.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_278,"kids",&local_279);
    JSON::makeArray();
    JSON::addDictionaryMember((JSON *)local_258,(string *)local_58,local_278);
    JSON::~JSON(&local_290);
    std::__cxx11::string::~string((string *)local_278);
    std::allocator<char>::~allocator(&local_279);
    QPDFOutlineObjectHelper::getKids
              (&local_2a8,
               (QPDFOutlineObjectHelper *)
               jo.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
    addOutlinesToJson(this,&local_2a8,(JSON *)local_258,page_numbers);
    std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector
              (&local_2a8);
    JSON::~JSON((JSON *)local_258);
    JSON::~JSON((JSON *)&og);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &j_destpage.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    JSON::~JSON((JSON *)local_58);
    __gnu_cxx::
    __normal_iterator<QPDFOutlineObjectHelper_*,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void
QPDFJob::addOutlinesToJson(
    std::vector<QPDFOutlineObjectHelper> outlines, JSON& j, std::map<QPDFObjGen, int>& page_numbers)
{
    for (auto& ol: outlines) {
        JSON jo = j.addArrayElement(JSON::makeDictionary());
        jo.addDictionaryMember("object", ol.getObjectHandle().getJSON(m->json_version));
        jo.addDictionaryMember("title", JSON::makeString(ol.getTitle()));
        jo.addDictionaryMember("dest", ol.getDest().getJSON(m->json_version, true));
        jo.addDictionaryMember("open", JSON::makeBool(ol.getCount() >= 0));
        QPDFObjectHandle page = ol.getDestPage();
        JSON j_destpage = JSON::makeNull();
        if (page.isIndirect()) {
            QPDFObjGen og = page.getObjGen();
            if (page_numbers.count(og)) {
                j_destpage = JSON::makeInt(page_numbers[og]);
            }
        }
        jo.addDictionaryMember("destpageposfrom1", j_destpage);
        JSON j_kids = jo.addDictionaryMember("kids", JSON::makeArray());
        addOutlinesToJson(ol.getKids(), j_kids, page_numbers);
    }
}